

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function_simd.cpp
# Opt level: O0

void sse::RgbToBgr(uint8_t *outY,uint8_t *inY,uint8_t *outYEnd,uint32_t rowSizeOut,
                  uint32_t rowSizeIn,uint8_t colorCount,uint32_t simdWidth,uint32_t totalSimdWidth,
                  uint32_t nonSimdWidth)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined8 local_e8;
  undefined8 uStack_e0;
  uint8_t *local_b8;
  undefined1 (*local_b0) [16];
  undefined1 (*local_80) [16];
  uint8_t *outXEndNonSimd;
  simd result;
  simd *dst;
  simd *src;
  uint8_t *outXEnd;
  uint8_t *outX;
  uint8_t *inX;
  simd ctrl;
  uint8_t colorCount_local;
  uint32_t rowSizeIn_local;
  uint32_t rowSizeOut_local;
  uint8_t *outYEnd_local;
  uint8_t *inY_local;
  
  auVar1 = vpinsrb_avx(ZEXT116(2),1,1);
  auVar1 = vpinsrb_avx(auVar1,0,2);
  auVar1 = vpinsrb_avx(auVar1,5,3);
  auVar1 = vpinsrb_avx(auVar1,4,4);
  auVar1 = vpinsrb_avx(auVar1,3,5);
  auVar1 = vpinsrb_avx(auVar1,8,6);
  auVar1 = vpinsrb_avx(auVar1,7,7);
  auVar1 = vpinsrb_avx(auVar1,6,8);
  auVar1 = vpinsrb_avx(auVar1,0xb,9);
  auVar1 = vpinsrb_avx(auVar1,10,10);
  auVar1 = vpinsrb_avx(auVar1,9,0xb);
  auVar1 = vpinsrb_avx(auVar1,0xe,0xc);
  auVar1 = vpinsrb_avx(auVar1,0xd,0xd);
  auVar1 = vpinsrb_avx(auVar1,0xc,0xe);
  auVar1 = vpinsrb_avx(auVar1,0xf,0xf);
  local_80 = (undefined1 (*) [16])inY;
  for (outXEndNonSimd = outY; outXEndNonSimd != outYEnd;
      outXEndNonSimd = outXEndNonSimd + rowSizeOut) {
    local_b0 = local_80;
    for (local_b8 = outXEndNonSimd; local_b8 != outXEndNonSimd + totalSimdWidth;
        local_b8 = local_b8 + simdWidth) {
      auVar2 = vpshufb_avx(*local_b0,auVar1);
      local_e8 = auVar2._0_8_;
      uStack_e0 = auVar2._8_8_;
      *(undefined8 *)local_b8 = local_e8;
      *(undefined8 *)(local_b8 + 8) = uStack_e0;
      local_b0 = (undefined1 (*) [16])(*local_b0 + simdWidth);
    }
    if (nonSimdWidth != 0) {
      for (; local_b8 != outXEndNonSimd + totalSimdWidth + nonSimdWidth;
          local_b8 = local_b8 + (int)(uint)colorCount) {
        local_b8[2] = (*local_b0)[0];
        local_b8[1] = (*local_b0)[1];
        *local_b8 = (*local_b0)[2];
        local_b0 = (undefined1 (*) [16])(*local_b0 + (int)(uint)colorCount);
      }
    }
    local_80 = (undefined1 (*) [16])(*local_80 + rowSizeIn);
  }
  return;
}

Assistant:

void RgbToBgr( uint8_t * outY, const uint8_t * inY, const uint8_t * outYEnd, uint32_t rowSizeOut, uint32_t rowSizeIn, 
                   const uint8_t colorCount, uint32_t simdWidth, uint32_t totalSimdWidth, uint32_t nonSimdWidth )
    {
        const simd ctrl = _mm_set_epi8(15, 12, 13, 14, 9, 10, 11, 6, 7, 8, 3, 4, 5, 0, 1, 2);
        for( ; outY != outYEnd; outY += rowSizeOut, inY += rowSizeIn ) {
            const uint8_t * inX  = inY;
            uint8_t       * outX = outY;

            const uint8_t * outXEnd = outX + totalSimdWidth;

            for( ; outX != outXEnd; outX += simdWidth, inX += simdWidth ) {
                const simd * src = reinterpret_cast<const simd*> (inX);
                simd * dst = reinterpret_cast<simd*> (outX);
                simd result = _mm_loadu_si128( src );
                result = _mm_shuffle_epi8( result, ctrl );
                _mm_storeu_si128( dst, result );
            }

            if( nonSimdWidth > 0 ) {
                const uint8_t * outXEndNonSimd = outXEnd + nonSimdWidth;
                for( ; outX != outXEndNonSimd; outX += colorCount, inX += colorCount ) {
                    *(outX + 2) = *(inX);
                    *(outX + 1) = *(inX + 1);
                    *(outX) = *(inX + 2);
                }
            }
        }
    }